

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UVector * __thiscall icu_63::RuleBasedTimeZone::copyRules(RuleBasedTimeZone *this,UVector *source)

{
  UBool UVar1;
  int32_t iVar2;
  RuleBasedTimeZone *this_00;
  long *plVar3;
  void *obj;
  RuleBasedTimeZone *local_60;
  TimeZoneRule *rule;
  int32_t i;
  UVector *rules;
  int32_t size;
  UErrorCode ec;
  UVector *source_local;
  RuleBasedTimeZone *this_local;
  
  if (source == (UVector *)0x0) {
    this_local = (RuleBasedTimeZone *)0x0;
  }
  else {
    rules._4_4_ = U_ZERO_ERROR;
    _size = source;
    source_local = (UVector *)this;
    rules._0_4_ = UVector::size(source);
    this_00 = (RuleBasedTimeZone *)UMemory::operator_new((UMemory *)0x28,(size_t)source);
    local_60 = (RuleBasedTimeZone *)0x0;
    if (this_00 != (RuleBasedTimeZone *)0x0) {
      UVector::UVector((UVector *)this_00,(int32_t)rules,(UErrorCode *)((long)&rules + 4));
      local_60 = this_00;
    }
    UVar1 = ::U_FAILURE(rules._4_4_);
    if (UVar1 == '\0') {
      for (rule._0_4_ = 0; (int)rule < (int32_t)rules; rule._0_4_ = (int)rule + 1) {
        plVar3 = (long *)UVector::elementAt(_size,(int)rule);
        obj = (void *)(**(code **)(*plVar3 + 0x18))();
        UVector::addElement((UVector *)local_60,obj,(UErrorCode *)((long)&rules + 4));
        UVar1 = ::U_FAILURE(rules._4_4_);
        if (UVar1 != '\0') break;
      }
      UVar1 = ::U_FAILURE(rules._4_4_);
      if (UVar1 == '\0') {
        this_local = local_60;
      }
      else {
        for (rule._0_4_ = 0; iVar2 = UVector::size((UVector *)local_60), (int)rule < iVar2;
            rule._0_4_ = (int)rule + 1) {
          plVar3 = (long *)UVector::orphanElementAt((UVector *)local_60,(int)rule);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
        }
        if (local_60 != (RuleBasedTimeZone *)0x0) {
          (*(local_60->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
        }
        this_local = (RuleBasedTimeZone *)0x0;
      }
    }
    else {
      this_local = (RuleBasedTimeZone *)0x0;
    }
  }
  return (UVector *)this_local;
}

Assistant:

UVector*
RuleBasedTimeZone::copyRules(UVector* source) {
    if (source == NULL) {
        return NULL;
    }
    UErrorCode ec = U_ZERO_ERROR;
    int32_t size = source->size();
    UVector *rules = new UVector(size, ec);
    if (U_FAILURE(ec)) {
        return NULL;
    }
    int32_t i;
    for (i = 0; i < size; i++) {
        rules->addElement(((TimeZoneRule*)source->elementAt(i))->clone(), ec);
        if (U_FAILURE(ec)) {
            break;
        }
    }
    if (U_FAILURE(ec)) {
        // In case of error, clean up
        for (i = 0; i < rules->size(); i++) {
            TimeZoneRule *rule = (TimeZoneRule*)rules->orphanElementAt(i);
            delete rule;
        }
        delete rules;
        return NULL;
    }
    return rules;
}